

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_det_gen(REF_INT n,REF_DBL *orig,REF_DBL *det)

{
  double dVar1;
  REF_STATUS RVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  REF_DBL RVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x4df,
           "ref_matrix_det_gen","malloc a of REF_DBL NULL");
    RVar2 = 2;
  }
  else {
    uVar6 = (ulong)(uint)n;
    if (0 < n) {
      uVar3 = 0;
      uVar12 = uVar6;
      do {
        memcpy((void *)((long)__ptr + uVar3 * 8),orig + uVar3,uVar6 * 8);
        uVar3 = (ulong)(uint)((int)uVar3 + n);
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    *det = 1.0;
    if (0 < n) {
      RVar14 = *det;
      uVar3 = 1;
      lVar4 = 8;
      lVar7 = 0;
      uVar12 = 0;
      do {
        uVar9 = (ulong)(uint)((int)uVar12 * n);
        RVar14 = RVar14 * *(double *)((long)__ptr + uVar9 * 8 + uVar12 * 8);
        uVar8 = uVar12 + 1;
        if (uVar8 < uVar6) {
          lVar10 = lVar4;
          uVar13 = uVar3;
          do {
            dVar1 = *(double *)((long)__ptr + uVar9 * 8 + uVar12 * 8);
            dVar16 = dVar1 * 1e+20;
            if (dVar16 <= -dVar16) {
              dVar16 = -dVar16;
            }
            dVar17 = *(double *)((long)__ptr + uVar13 * 8 + uVar12 * uVar6 * 8);
            dVar15 = -dVar17;
            if (dVar17 <= dVar15) {
              dVar17 = dVar15;
            }
            if (dVar16 <= dVar17) {
              *det = RVar14;
              free(__ptr);
              *det = 0.0;
              goto LAB_001cf950;
            }
            uVar5 = uVar6;
            pvVar11 = __ptr;
            do {
              *(double *)((long)pvVar11 + lVar10) =
                   *(double *)((long)pvVar11 + lVar7) * (dVar15 / dVar1) +
                   *(double *)((long)pvVar11 + lVar10);
              pvVar11 = (void *)((long)pvVar11 + uVar6 * 8);
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
            uVar13 = uVar13 + 1;
            lVar10 = lVar10 + 8;
          } while (uVar13 != uVar6);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 8;
        lVar7 = lVar7 + 8;
        uVar12 = uVar8;
      } while (uVar8 != uVar6);
      *det = RVar14;
    }
    free(__ptr);
LAB_001cf950:
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_gen(REF_INT n, REF_DBL *orig, REF_DBL *det) {
  REF_DBL *a;
  REF_DBL scale;
  REF_INT i, j, k;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  *det = 1.0;

  for (j = 0; j < n; j++) {
    (*det) *= a[j + n * j];
    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        /* zero pivot */
        ref_free(a);
        *det = 0.0;
        return REF_SUCCESS;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
    }
  }

  ref_free(a);

  return REF_SUCCESS;
}